

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined1 auVar1 [16];
  uint uVar2;
  aiMeshMorphAnim *this;
  Accessor *pAVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong uVar6;
  uint *puVar7;
  double *pdVar8;
  aiMeshMorphKey *paVar9;
  ulong uVar10;
  float local_b4;
  aiMeshMorphKey *local_a0;
  uint local_78;
  uint local_74;
  uint j;
  uint i;
  uint k;
  uint numMorphs;
  float *values;
  float *times;
  string local_48;
  aiMeshMorphAnim *local_28;
  aiMeshMorphAnim *anim;
  AnimationSamplers *samplers_local;
  Node *node_local;
  Asset *r_local;
  
  anim = (aiMeshMorphAnim *)samplers;
  samplers_local = (AnimationSamplers *)node;
  node_local = (Node *)r;
  this = (aiMeshMorphAnim *)operator_new(0x410);
  aiMeshMorphAnim::aiMeshMorphAnim(this);
  local_28 = this;
  GetNodeName_abi_cxx11_(&local_48,(Node *)samplers_local);
  aiString::operator=(&local_28->mName,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)((anim->mName).data + 0x14) != 0) {
    values = (float *)0x0;
    pAVar3 = glTF2::Ref<glTF2::Accessor>::operator->
                       (*(Ref<glTF2::Accessor> **)((anim->mName).data + 0x14));
    glTF2::Accessor::ExtractData<float>(pAVar3,&values);
    _k = (float *)0x0;
    pAVar3 = glTF2::Ref<glTF2::Accessor>::operator->
                       ((Ref<glTF2::Accessor> *)(*(long *)((anim->mName).data + 0x14) + 0x10));
    glTF2::Accessor::ExtractData<float>(pAVar3,(float **)&k);
    pAVar3 = glTF2::Ref<glTF2::Accessor>::operator->
                       (*(Ref<glTF2::Accessor> **)((anim->mName).data + 0x14));
    local_28->mNumKeys = (uint)pAVar3->count;
    pAVar3 = glTF2::Ref<glTF2::Accessor>::operator->
                       ((Ref<glTF2::Accessor> *)(*(long *)((anim->mName).data + 0x14) + 0x10));
    uVar2 = (uint)((pAVar3->count & 0xffffffff) / (ulong)local_28->mNumKeys);
    uVar6 = CONCAT44(0,local_28->mNumKeys);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar4 = SUB168(auVar1 * ZEXT816(0x20),0);
    uVar10 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar10 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar10);
    *puVar5 = uVar6;
    paVar9 = (aiMeshMorphKey *)(puVar5 + 1);
    if (uVar6 != 0) {
      local_a0 = paVar9;
      do {
        aiMeshMorphKey::aiMeshMorphKey(local_a0);
        local_a0 = local_a0 + 1;
      } while (local_a0 != paVar9 + uVar6);
    }
    local_28->mKeys = paVar9;
    j = 0;
    for (local_74 = 0; local_74 < local_28->mNumKeys; local_74 = local_74 + 1) {
      local_28->mKeys[local_74].mTime = (double)(values[local_74] * 1000.0);
      local_28->mKeys[local_74].mNumValuesAndWeights = uVar2;
      uVar6 = SUB168(ZEXT416(uVar2) * ZEXT816(4),0);
      if (SUB168(ZEXT416(uVar2) * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      puVar7 = (uint *)operator_new__(uVar6);
      local_28->mKeys[local_74].mValues = puVar7;
      uVar6 = SUB168(ZEXT416(uVar2) * ZEXT816(8),0);
      if (SUB168(ZEXT416(uVar2) * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pdVar8 = (double *)operator_new__(uVar6);
      local_28->mKeys[local_74].mWeights = pdVar8;
      for (local_78 = 0; local_78 < uVar2; local_78 = local_78 + 1) {
        local_28->mKeys[local_74].mValues[local_78] = local_78;
        if (0.0 < _k[j] || _k[j] == 0.0) {
          local_b4 = _k[j];
        }
        else {
          local_b4 = 0.0;
        }
        local_28->mKeys[local_74].mWeights[local_78] = (double)local_b4;
        j = j + 1;
      }
    }
    if (values != (float *)0x0) {
      operator_delete__(values);
    }
    if (_k != (float *)0x0) {
      operator_delete__(_k);
    }
  }
  return local_28;
}

Assistant:

aiMeshMorphAnim *CreateMeshMorphAnim(glTF2::Asset &r, Node &node, AnimationSamplers &samplers) {
	aiMeshMorphAnim *anim = new aiMeshMorphAnim();
	anim->mName = GetNodeName(node);

	static const float kMillisecondsFromSeconds = 1000.f;

	if (nullptr != samplers.weight) {
		float *times = nullptr;
		samplers.weight->input->ExtractData(times);
		float *values = nullptr;
		samplers.weight->output->ExtractData(values);
		anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

		const unsigned int numMorphs = (unsigned int)samplers.weight->output->count / anim->mNumKeys;

		anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
		unsigned int k = 0u;
		for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
			anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
			anim->mKeys[i].mNumValuesAndWeights = numMorphs;
			anim->mKeys[i].mValues = new unsigned int[numMorphs];
			anim->mKeys[i].mWeights = new double[numMorphs];

			for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
				anim->mKeys[i].mValues[j] = j;
				anim->mKeys[i].mWeights[j] = (0.f > values[k]) ? 0.f : values[k];
			}
		}

		delete[] times;
		delete[] values;
	}

	return anim;
}